

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall exe_reconstructor::sectioninfo::copydata(sectioninfo *this,ReadWriter_ptr *w)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  void *__s;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar3;
  value_type_conflict2 *__val;
  
  (*((this->r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ReadWriter
    [4])();
  iVar2 = (*((this->r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ReadWriter[6])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    uVar3 = 0;
    do {
      __s = operator_new(0x10000);
      memset(__s,0,0x10000);
      peVar1 = (this->r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar2 = (*peVar1->_vptr_ReadWriter[2])(peVar1,__s,0x10000);
      peVar1 = (w->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar1->_vptr_ReadWriter[3])(peVar1,__s,CONCAT44(extraout_var_00,iVar2));
      uVar3 = uVar3 + CONCAT44(extraout_var_00,iVar2);
      operator_delete(__s,0x10000);
      iVar2 = (*((this->r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ReadWriter[6])();
    } while (uVar3 < CONCAT44(extraout_var_01,iVar2));
  }
  return;
}

Assistant:

void copydata(ReadWriter_ptr w)
        {
            uint64_t pos= 0;
            r->setpos(0);
            while (pos < r->size()) {
                ByteVector buf(65536);
                size_t n= r->read(&buf[0], buf.size());
                w->write(&buf[0], n);
                pos += n;
            }
        }